

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

void __thiscall re2::CharClassBuilder::Negate(CharClassBuilder *this)

{
  _Rb_tree_header *p_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  _Rb_tree_node_base *p_Var4;
  int iVar5;
  size_t i;
  ulong uVar6;
  long lVar7;
  vector<re2::RuneRange,_std::allocator<re2::RuneRange>_> v;
  RuneRange local_50;
  _Vector_base<re2::RuneRange,_std::allocator<re2::RuneRange>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<re2::RuneRange,_std::allocator<re2::RuneRange>_>::reserve
            ((vector<re2::RuneRange,_std::allocator<re2::RuneRange>_> *)&local_48,
             (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1);
  p_Var4 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->ranges_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    local_50.lo = 0;
    local_50.hi = 0x10ffff;
    std::vector<re2::RuneRange,_std::allocator<re2::RuneRange>_>::emplace_back<re2::RuneRange>
              ((vector<re2::RuneRange,_std::allocator<re2::RuneRange>_> *)&local_48,&local_50);
  }
  else {
    iVar5 = 0;
    if (p_Var4[1]._M_color == _S_red) {
      iVar5 = *(int *)&p_Var4[1].field_0x4 + 1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    }
    for (; (_Rb_tree_header *)p_Var4 != p_Var1;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      local_50.hi = p_Var4[1]._M_color - _S_black;
      local_50.lo = iVar5;
      std::vector<re2::RuneRange,_std::allocator<re2::RuneRange>_>::emplace_back<re2::RuneRange>
                ((vector<re2::RuneRange,_std::allocator<re2::RuneRange>_> *)&local_48,&local_50);
      iVar5 = *(int *)&p_Var4[1].field_0x4 + 1;
    }
    if (iVar5 < 0x110000) {
      local_50.hi = 0x10ffff;
      local_50.lo = iVar5;
      std::vector<re2::RuneRange,_std::allocator<re2::RuneRange>_>::emplace_back<re2::RuneRange>
                ((vector<re2::RuneRange,_std::allocator<re2::RuneRange>_> *)&local_48,&local_50);
    }
  }
  std::
  _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
  ::clear(&(this->ranges_)._M_t);
  lVar7 = 0;
  for (uVar6 = 0;
      uVar6 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar6 = uVar6 + 1) {
    std::
    _Rb_tree<re2::RuneRange,re2::RuneRange,std::_Identity<re2::RuneRange>,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
    ::_M_insert_unique<re2::RuneRange_const&>
              ((_Rb_tree<re2::RuneRange,re2::RuneRange,std::_Identity<re2::RuneRange>,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
                *)&this->ranges_,
               (RuneRange *)((long)&(local_48._M_impl.super__Vector_impl_data._M_start)->lo + lVar7)
              );
    lVar7 = lVar7 + 8;
  }
  uVar2 = this->upper_;
  uVar3 = this->lower_;
  uVar6 = CONCAT44(~uVar3,~uVar2) & 0x3ffffff03ffffff;
  this->upper_ = (int)uVar6;
  this->lower_ = (int)(uVar6 >> 0x20);
  this->nrunes_ = 0x110000 - this->nrunes_;
  std::_Vector_base<re2::RuneRange,_std::allocator<re2::RuneRange>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void CharClassBuilder::Negate() {
  // Build up negation and then copy in.
  // Could edit ranges in place, but C++ won't let me.
  std::vector<RuneRange> v;
  v.reserve(ranges_.size() + 1);

  // In negation, first range begins at 0, unless
  // the current class begins at 0.
  iterator it = begin();
  if (it == end()) {
    v.push_back(RuneRange(0, Runemax));
  } else {
    int nextlo = 0;
    if (it->lo == 0) {
      nextlo = it->hi + 1;
      ++it;
    }
    for (; it != end(); ++it) {
      v.push_back(RuneRange(nextlo, it->lo - 1));
      nextlo = it->hi + 1;
    }
    if (nextlo <= Runemax)
      v.push_back(RuneRange(nextlo, Runemax));
  }

  ranges_.clear();
  for (size_t i = 0; i < v.size(); i++)
    ranges_.insert(v[i]);

  upper_ = AlphaMask & ~upper_;
  lower_ = AlphaMask & ~lower_;
  nrunes_ = Runemax+1 - nrunes_;
}